

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_single_store_elim_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LocalSingleStoreElimPass::InitExtensionAllowList(LocalSingleStoreElimPass *this)

{
  long lVar1;
  allocator<char> local_80e;
  allocator<char> local_80d;
  allocator<char> local_80c;
  allocator<char> local_80b;
  allocator<char> local_80a;
  allocator<char> local_809;
  allocator<char> local_808;
  allocator<char> local_807;
  allocator<char> local_806;
  allocator<char> local_805;
  allocator<char> local_804;
  allocator<char> local_803;
  allocator<char> local_802;
  allocator<char> local_801;
  allocator<char> local_800;
  allocator<char> local_7ff;
  allocator<char> local_7fe;
  allocator<char> local_7fd;
  allocator<char> local_7fc;
  allocator<char> local_7fb;
  allocator<char> local_7fa;
  allocator<char> local_7f9;
  allocator<char> local_7f8;
  allocator<char> local_7f7;
  allocator<char> local_7f6;
  allocator<char> local_7f5;
  allocator<char> local_7f4;
  allocator<char> local_7f3;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  allocator<char> local_7f0;
  allocator<char> local_7ef;
  allocator<char> local_7ee;
  allocator<char> local_7ed;
  allocator<char> local_7ec;
  allocator<char> local_7eb;
  allocator<char> local_7ea;
  allocator<char> local_7e9;
  allocator<char> local_7e8;
  allocator<char> local_7e7;
  allocator<char> local_7e6;
  allocator<char> local_7e5;
  allocator<char> local_7e4;
  allocator<char> local_7e3;
  allocator<char> local_7e2;
  allocator<char> local_7e1;
  allocator<char> local_7e0;
  allocator<char> local_7df;
  allocator<char> local_7de;
  allocator<char> local_7dd;
  allocator<char> local_7dc;
  allocator<char> local_7db;
  allocator<char> local_7da;
  allocator<char> local_7d9;
  allocator<char> local_7d8;
  allocator<char> local_7d7;
  allocator<char> local_7d6;
  allocator<char> local_7d5;
  allocator<char> local_7d4;
  allocator<char> local_7d3;
  allocator<char> local_7d2;
  allocator<char> local_7d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  string local_7b0 [32];
  string local_790 [32];
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  string local_710 [32];
  string local_6f0 [32];
  string local_6d0 [32];
  string local_6b0 [32];
  string local_690 [32];
  string local_670 [32];
  string local_650 [32];
  string local_630 [32];
  string local_610 [32];
  string local_5f0 [32];
  string local_5d0 [32];
  string local_5b0 [32];
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [32];
  string local_450 [32];
  string local_430 [32];
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  string local_390 [32];
  string local_370 [32];
  string local_350 [32];
  string local_330 [32];
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,"SPV_AMD_shader_explicit_vertex_parameter",&local_7d1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7b0,"SPV_AMD_shader_trinary_minmax",&local_7d2);
  std::__cxx11::string::string<std::allocator<char>>(local_790,"SPV_AMD_gcn_shader",&local_7d3);
  std::__cxx11::string::string<std::allocator<char>>(local_770,"SPV_KHR_shader_ballot",&local_7d4);
  std::__cxx11::string::string<std::allocator<char>>(local_750,"SPV_AMD_shader_ballot",&local_7d5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_730,"SPV_AMD_gpu_shader_half_float",&local_7d6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_710,"SPV_KHR_shader_draw_parameters",&local_7d7);
  std::__cxx11::string::string<std::allocator<char>>(local_6f0,"SPV_KHR_subgroup_vote",&local_7d8);
  std::__cxx11::string::string<std::allocator<char>>(local_6d0,"SPV_KHR_8bit_storage",&local_7d9);
  std::__cxx11::string::string<std::allocator<char>>(local_6b0,"SPV_KHR_16bit_storage",&local_7da);
  std::__cxx11::string::string<std::allocator<char>>(local_690,"SPV_KHR_device_group",&local_7db);
  std::__cxx11::string::string<std::allocator<char>>(local_670,"SPV_KHR_multiview",&local_7dc);
  std::__cxx11::string::string<std::allocator<char>>
            (local_650,"SPV_NVX_multiview_per_view_attributes",&local_7dd);
  std::__cxx11::string::string<std::allocator<char>>(local_630,"SPV_NV_viewport_array2",&local_7de);
  std::__cxx11::string::string<std::allocator<char>>
            (local_610,"SPV_NV_stereo_view_rendering",&local_7df);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5f0,"SPV_NV_sample_mask_override_coverage",&local_7e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5d0,"SPV_NV_geometry_shader_passthrough",&local_7e1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5b0,"SPV_AMD_texture_gather_bias_lod",&local_7e2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_590,"SPV_KHR_storage_buffer_storage_class",&local_7e3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_570,"SPV_KHR_variable_pointers",&local_7e4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_550,"SPV_AMD_gpu_shader_int16",&local_7e5);
  std::__cxx11::string::string<std::allocator<char>>
            (local_530,"SPV_KHR_post_depth_coverage",&local_7e6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_510,"SPV_KHR_shader_atomic_counter_ops",&local_7e7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f0,"SPV_EXT_shader_stencil_export",&local_7e8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4d0,"SPV_EXT_shader_viewport_index_layer",&local_7e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4b0,"SPV_AMD_shader_image_load_store_lod",&local_7ea);
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,"SPV_AMD_shader_fragment_mask",&local_7eb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_470,"SPV_EXT_fragment_fully_covered",&local_7ec);
  std::__cxx11::string::string<std::allocator<char>>
            (local_450,"SPV_AMD_gpu_shader_half_float_fetch",&local_7ed);
  std::__cxx11::string::string<std::allocator<char>>
            (local_430,"SPV_GOOGLE_decorate_string",&local_7ee);
  std::__cxx11::string::string<std::allocator<char>>
            (local_410,"SPV_GOOGLE_hlsl_functionality1",&local_7ef);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f0,"SPV_NV_shader_subgroup_partitioned",&local_7f0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d0,"SPV_EXT_descriptor_indexing",&local_7f1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3b0,"SPV_NV_fragment_shader_barycentric",&local_7f2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_390,"SPV_NV_compute_shader_derivatives",&local_7f3);
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"SPV_NV_shader_image_footprint",&local_7f4);
  std::__cxx11::string::string<std::allocator<char>>(local_350,"SPV_NV_shading_rate",&local_7f5);
  std::__cxx11::string::string<std::allocator<char>>(local_330,"SPV_NV_mesh_shader",&local_7f6);
  std::__cxx11::string::string<std::allocator<char>>(local_310,"SPV_EXT_mesh_shader",&local_7f7);
  std::__cxx11::string::string<std::allocator<char>>(local_2f0,"SPV_NV_ray_tracing",&local_7f8);
  std::__cxx11::string::string<std::allocator<char>>(local_2d0,"SPV_KHR_ray_query",&local_7f9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b0,"SPV_EXT_fragment_invocation_density",&local_7fa);
  std::__cxx11::string::string<std::allocator<char>>
            (local_290,"SPV_EXT_physical_storage_buffer",&local_7fb);
  std::__cxx11::string::string<std::allocator<char>>
            (local_270,"SPV_KHR_physical_storage_buffer",&local_7fc);
  std::__cxx11::string::string<std::allocator<char>>
            (local_250,"SPV_KHR_terminate_invocation",&local_7fd);
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"SPV_KHR_subgroup_uniform_control_flow",&local_7fe);
  std::__cxx11::string::string<std::allocator<char>>
            (local_210,"SPV_KHR_integer_dot_product",&local_7ff);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,"SPV_EXT_shader_image_int64",&local_800);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d0,"SPV_KHR_non_semantic_info",&local_801);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b0,"SPV_KHR_uniform_group_instructions",&local_802);
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,"SPV_KHR_fragment_shader_barycentric",&local_803);
  std::__cxx11::string::string<std::allocator<char>>
            (local_170,"SPV_KHR_vulkan_memory_model",&local_804);
  std::__cxx11::string::string<std::allocator<char>>(local_150,"SPV_NV_bindless_texture",&local_805)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"SPV_EXT_shader_atomic_float_add",&local_806);
  std::__cxx11::string::string<std::allocator<char>>
            (local_110,"SPV_EXT_fragment_shader_interlock",&local_807);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f0,"SPV_KHR_compute_shader_derivatives",&local_808);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"SPV_NV_cooperative_matrix",&local_809);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"SPV_KHR_cooperative_matrix",&local_80a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"SPV_KHR_ray_tracing_position_fetch",&local_80b);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"SPV_AMDX_shader_enqueue",&local_80c);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"SPV_KHR_fragment_shading_rate",&local_80d);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"SPV_KHR_ray_tracing",&local_80e);
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::insert<std::__cxx11::string_const*>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&this->extensions_allowlist_,&local_7d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff0);
  lVar1 = 0x7a0;
  do {
    std::__cxx11::string::_M_dispose();
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

void LocalSingleStoreElimPass::InitExtensionAllowList() {
  extensions_allowlist_.insert({"SPV_AMD_shader_explicit_vertex_parameter",
                                "SPV_AMD_shader_trinary_minmax",
                                "SPV_AMD_gcn_shader",
                                "SPV_KHR_shader_ballot",
                                "SPV_AMD_shader_ballot",
                                "SPV_AMD_gpu_shader_half_float",
                                "SPV_KHR_shader_draw_parameters",
                                "SPV_KHR_subgroup_vote",
                                "SPV_KHR_8bit_storage",
                                "SPV_KHR_16bit_storage",
                                "SPV_KHR_device_group",
                                "SPV_KHR_multiview",
                                "SPV_NVX_multiview_per_view_attributes",
                                "SPV_NV_viewport_array2",
                                "SPV_NV_stereo_view_rendering",
                                "SPV_NV_sample_mask_override_coverage",
                                "SPV_NV_geometry_shader_passthrough",
                                "SPV_AMD_texture_gather_bias_lod",
                                "SPV_KHR_storage_buffer_storage_class",
                                "SPV_KHR_variable_pointers",
                                "SPV_AMD_gpu_shader_int16",
                                "SPV_KHR_post_depth_coverage",
                                "SPV_KHR_shader_atomic_counter_ops",
                                "SPV_EXT_shader_stencil_export",
                                "SPV_EXT_shader_viewport_index_layer",
                                "SPV_AMD_shader_image_load_store_lod",
                                "SPV_AMD_shader_fragment_mask",
                                "SPV_EXT_fragment_fully_covered",
                                "SPV_AMD_gpu_shader_half_float_fetch",
                                "SPV_GOOGLE_decorate_string",
                                "SPV_GOOGLE_hlsl_functionality1",
                                "SPV_NV_shader_subgroup_partitioned",
                                "SPV_EXT_descriptor_indexing",
                                "SPV_NV_fragment_shader_barycentric",
                                "SPV_NV_compute_shader_derivatives",
                                "SPV_NV_shader_image_footprint",
                                "SPV_NV_shading_rate",
                                "SPV_NV_mesh_shader",
                                "SPV_EXT_mesh_shader",
                                "SPV_NV_ray_tracing",
                                "SPV_KHR_ray_query",
                                "SPV_EXT_fragment_invocation_density",
                                "SPV_EXT_physical_storage_buffer",
                                "SPV_KHR_physical_storage_buffer",
                                "SPV_KHR_terminate_invocation",
                                "SPV_KHR_subgroup_uniform_control_flow",
                                "SPV_KHR_integer_dot_product",
                                "SPV_EXT_shader_image_int64",
                                "SPV_KHR_non_semantic_info",
                                "SPV_KHR_uniform_group_instructions",
                                "SPV_KHR_fragment_shader_barycentric",
                                "SPV_KHR_vulkan_memory_model",
                                "SPV_NV_bindless_texture",
                                "SPV_EXT_shader_atomic_float_add",
                                "SPV_EXT_fragment_shader_interlock",
                                "SPV_KHR_compute_shader_derivatives",
                                "SPV_NV_cooperative_matrix",
                                "SPV_KHR_cooperative_matrix",
                                "SPV_KHR_ray_tracing_position_fetch",
                                "SPV_AMDX_shader_enqueue",
                                "SPV_KHR_fragment_shading_rate",
                                "SPV_KHR_ray_tracing"});
}